

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_ary.c
# Opt level: O2

void adt_ary_create(adt_ary_t *self,_func_void_void_ptr *pDestructor)

{
  self->ppAlloc = (void **)0x0;
  self->pFirst = (void **)0x0;
  self->s32AllocLen = 0;
  self->s32CurLen = 0;
  self->pDestructor = pDestructor;
  self->pFillElem = (void *)0x0;
  self->destructorEnable = true;
  return;
}

Assistant:

void adt_ary_create(adt_ary_t *self,void (*pDestructor)(void*)){
	self->ppAlloc = (void**) 0;
	self->pFirst = (void**) 0;
	self->s32AllocLen = 0;
	self->s32CurLen = 0;
	self->pDestructor = pDestructor;
	self->pFillElem = (void*)0;
	self->destructorEnable = true;
}